

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall
icu_63::RBBITableBuilder::sortedAdd(RBBITableBuilder *this,UVector **vector,int32_t val)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  UVector *pUVar4;
  UVector *local_60;
  int32_t valAtI;
  int32_t vSize;
  UVector *vec;
  int local_20;
  int32_t i;
  int32_t val_local;
  UVector **vector_local;
  RBBITableBuilder *this_local;
  
  if (*vector == (UVector *)0x0) {
    pUVar4 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)vector);
    local_60 = (UVector *)0x0;
    if (pUVar4 != (UVector *)0x0) {
      UVector::UVector(pUVar4,this->fStatus);
      local_60 = pUVar4;
    }
    *vector = local_60;
  }
  if ((*vector != (UVector *)0x0) && (UVar1 = ::U_FAILURE(*this->fStatus), UVar1 == '\0')) {
    pUVar4 = *vector;
    iVar2 = UVector::size(pUVar4);
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      iVar3 = UVector::elementAti(pUVar4,local_20);
      if (iVar3 == val) {
        return;
      }
      if (val < iVar3) break;
    }
    UVector::insertElementAt(pUVar4,val,local_20,this->fStatus);
  }
  return;
}

Assistant:

void RBBITableBuilder::sortedAdd(UVector **vector, int32_t val) {
    int32_t i;

    if (*vector == NULL) {
        *vector = new UVector(*fStatus);
    }
    if (*vector == NULL || U_FAILURE(*fStatus)) {
        return;
    }
    UVector *vec = *vector;
    int32_t  vSize = vec->size();
    for (i=0; i<vSize; i++) {
        int32_t valAtI = vec->elementAti(i);
        if (valAtI == val) {
            // The value is already in the vector.  Don't add it again.
            return;
        }
        if (valAtI > val) {
            break;
        }
    }
    vec->insertElementAt(val, i, *fStatus);
}